

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_soft_max(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffd8;
  ggml_context *in_stack_ffffffffffffffe0;
  
  if (in_RSI->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_view_tensor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    pgVar1->op = GGML_OP_SOFT_MAX;
    pgVar1->grad = (ggml_tensor *)0x0;
    pgVar1->src0 = in_RSI;
    pgVar1->src1 = (ggml_tensor *)0x0;
    return pgVar1;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xfcd,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_soft_max(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    result->op   = GGML_OP_SOFT_MAX;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}